

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RandSequenceStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSequenceStatement,slang::ast::RandSeqProductionSymbol_const*&,slang::SourceRange>
          (BumpAllocator *this,RandSeqProductionSymbol **args,SourceRange *args_1)

{
  RandSequenceStatement *this_00;
  SourceRange *args_local_1;
  RandSeqProductionSymbol **args_local;
  BumpAllocator *this_local;
  
  this_00 = (RandSequenceStatement *)allocate(this,0x28,8);
  ast::RandSequenceStatement::RandSequenceStatement(this_00,*args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }